

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O2

DdNode * Extra_bddBitsToCube(DdManager *dd,int Code,int CodeWidth,DdNode **pbVars,int fMsbFirst)

{
  ulong uVar1;
  DdNode **ppDVar2;
  DdNode *n;
  uint uVar3;
  DdNode *n_00;
  uint uVar4;
  ulong uVar5;
  
  n_00 = dd->one;
  Cudd_Ref(n_00);
  uVar5 = 0;
  uVar1 = 0;
  if (0 < CodeWidth) {
    uVar1 = (ulong)(uint)CodeWidth;
  }
  uVar4 = CodeWidth - 1;
  for (; uVar1 != uVar5; uVar5 = uVar5 + 1) {
    ppDVar2 = pbVars;
    if (pbVars == (DdNode **)0x0) {
      ppDVar2 = dd->vars;
    }
    uVar3 = uVar4;
    if (fMsbFirst == 0) {
      uVar3 = (uint)uVar5;
    }
    n = Cudd_bddAnd(dd,n_00,(DdNode *)
                            ((ulong)(((uint)~Code >> (uVar3 & 0x1f) & 1) != 0) ^
                            (ulong)ppDVar2[uVar5]));
    Cudd_Ref(n);
    Cudd_RecursiveDeref(dd,n_00);
    uVar4 = uVar4 - 1;
    n_00 = n;
  }
  Cudd_Deref(n_00);
  return n_00;
}

Assistant:

DdNode * Extra_bddBitsToCube( DdManager * dd, int Code, int CodeWidth, DdNode ** pbVars, int fMsbFirst )
{
    int z;
    DdNode * bTemp, * bVar, * bVarBdd, * bResult;

    bResult = b1;   Cudd_Ref( bResult );
    for ( z = 0; z < CodeWidth; z++ )
    {
        bVarBdd = (pbVars)? pbVars[z]: dd->vars[z];
        if ( fMsbFirst )
            bVar = Cudd_NotCond( bVarBdd, (Code & (1 << (CodeWidth-1-z)))==0 );
        else
            bVar = Cudd_NotCond( bVarBdd, (Code & (1 << (z)))==0 );
        bResult = Cudd_bddAnd( dd, bTemp = bResult, bVar );     Cudd_Ref( bResult );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bResult );

    return bResult;
}